

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

bool __thiscall
mjs::object::do_redefine_own_property(object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  property *ppVar4;
  gc_vector<mjs::object::property> *this_00;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar5;
  wstring_view key;
  property_attribute local_3c;
  value_representation local_38;
  uint *local_30;
  
  local_3c = attr;
  puVar3 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
  key._M_len = (ulong)*puVar3;
  key._M_str = (wchar_t *)(puVar3 + 1);
  pVar5 = find(this,key);
  ppVar4 = pVar5.first;
  if (ppVar4 == (property *)0x0) {
    local_30 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
    local_38.repr_ = (uint64_t)*local_30;
    local_30 = local_30 + 1;
    uVar2 = (*this->_vptr_object[6])(this);
    if (0x10 < uVar2) {
      __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                    ,0x24,"bool mjs::is_valid(property_attribute)");
    }
    if (uVar2 != 0x10) {
      __assert_fail("!is_valid(own_property_attributes(name.view()))",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,0x66,
                    "virtual bool mjs::object::do_redefine_own_property(const string &, const value &, property_attribute)"
                   );
    }
    this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                        (&this->properties_,this->heap_);
    gc_vector<mjs::object::property>::
    emplace_back<mjs::string_const&,mjs::value_const&,mjs::property_attribute&>
              (this_00,name,val,&local_3c);
  }
  else {
    bVar1 = has_attributes(attr,accessor);
    if (bVar1) {
      __assert_fail("!has_attributes(attr, property_attribute::accessor)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,0x61,
                    "virtual bool mjs::object::do_redefine_own_property(const string &, const value &, property_attribute)"
                   );
    }
    ppVar4->attributes_ = attr;
    value_representation::value_representation(&local_38,val);
    (ppVar4->value_).repr_ = local_38.repr_;
  }
  return true;
}

Assistant:

bool object::do_redefine_own_property(const string& name, const value& val, property_attribute attr) {
    if (auto it = find(name.view()).first) {
        assert(!has_attributes(attr, property_attribute::accessor));
        it->attributes(attr);
        it->raw_put(val);
        return true;
    }
    assert(!is_valid(own_property_attributes(name.view())));
    properties_.dereference(heap()).emplace_back(name, val, attr);
    return true;
}